

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O0

void __thiscall
google::
sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::sparse_hashtable(sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *this,MoveDontCopyT mover,
                  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                  *ht,size_type min_buckets_wanted)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_type sVar3;
  size_type sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *in_RDX;
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_RDI;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *in_stack_00000030;
  size_type in_stack_00000088;
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_00000090;
  MoveDontCopyT in_stack_0000009c;
  sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_000000a0;
  sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *this_00;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_30 [3];
  
  uVar1 = *in_RDX;
  uVar2 = in_RDX[1];
  sVar3 = in_RDX[2];
  sVar4 = in_RDX[3];
  uVar5 = in_RDX[4];
  uVar6 = in_RDX[5];
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_factor_ = (float)(int)uVar5;
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_factor_ = (float)(int)((ulong)uVar5 >> 0x20);
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  consider_shrink_ = (bool)(char)uVar6;
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  use_empty_ = (bool)(char)((ulong)uVar6 >> 8);
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  use_deleted_ = (bool)(char)((ulong)uVar6 >> 0x10);
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  field_0x2b = (char)((ulong)uVar6 >> 0x18);
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  num_ht_copies_ = (int)((ulong)uVar6 >> 0x20);
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  enlarge_threshold_ = sVar3;
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  shrink_threshold_ = sVar4;
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.id_ = (int)uVar1;
  (in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
  super_TransparentHasher.super_Hasher.num_hashes_ = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)
   &(in_RDI->settings).super_sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>.
    super_TransparentHasher.super_Hasher.num_compares_ = uVar2;
  uVar1 = in_RDX[6];
  uVar2 = in_RDX[7];
  (in_RDI->key_info).super_TransparentHasher.super_Hasher.id_ = (int)uVar1;
  (in_RDI->key_info).super_TransparentHasher.super_Hasher.num_hashes_ = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(in_RDI->key_info).super_TransparentHasher.super_Hasher.num_compares_ = uVar2;
  in_RDI->num_deleted = 0;
  this_00 = (sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4> *)&in_RDI->table;
  get_allocator(in_RDI);
  sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::
  sparsetable((sparsetable<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)ht,min_buckets_wanted,in_stack_00000030);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_30);
  bucket_count((sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xa257d5);
  sparsehash_internal::sh_hashtable_settings<int,_TransparentHasher,_unsigned_long,_4>::
  reset_thresholds(this_00,(size_type)in_RDI);
  move_from(in_stack_000000a0,in_stack_0000009c,in_stack_00000090,in_stack_00000088);
  return;
}

Assistant:

sparse_hashtable(MoveDontCopyT mover, sparse_hashtable& ht,
                   size_type min_buckets_wanted = HT_DEFAULT_STARTING_BUCKETS)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        table(0, ht.get_allocator()) {
    settings.reset_thresholds(bucket_count());
    move_from(mover, ht, min_buckets_wanted);  // ignores deleted entries
  }